

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_aesdec_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  long lVar1;
  uint uVar2;
  uint64_t uStack_88;
  ZMMReg st;
  ZMMReg rk;
  
  st._q_ZMMReg[5] = d->_q_ZMMReg[6];
  st._q_ZMMReg[6] = d->_q_ZMMReg[7];
  st._q_ZMMReg[3] = d->_q_ZMMReg[4];
  st._q_ZMMReg[4] = d->_q_ZMMReg[5];
  st._q_ZMMReg[1] = d->_q_ZMMReg[2];
  st._q_ZMMReg[2] = d->_q_ZMMReg[3];
  uStack_88 = d->_q_ZMMReg[0];
  st._q_ZMMReg[0] = d->_q_ZMMReg[1];
  rk._q_ZMMReg[5] = s->_q_ZMMReg[6];
  rk._q_ZMMReg[6] = s->_q_ZMMReg[7];
  rk._q_ZMMReg[3] = s->_q_ZMMReg[4];
  rk._q_ZMMReg[4] = s->_q_ZMMReg[5];
  rk._q_ZMMReg[1] = s->_q_ZMMReg[2];
  rk._q_ZMMReg[2] = s->_q_ZMMReg[3];
  st._q_ZMMReg[7] = s->_q_ZMMReg[0];
  rk._q_ZMMReg[0] = s->_q_ZMMReg[1];
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    uVar2 = AES_Td1[*(byte *)((long)&uStack_88 + (ulong)""[lVar1 * 4 + 1])] ^
            AES_Td0[*(byte *)((long)&uStack_88 + (ulong)""[lVar1 * 4])] ^
            AES_Td2[*(byte *)((long)&uStack_88 + (ulong)""[lVar1 * 4 + 2])] ^
            AES_Td3[*(byte *)((long)&uStack_88 + (ulong)""[lVar1 * 4 + 3])];
    d->_l_ZMMReg[lVar1] =
         (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ^
         *(uint *)((long)&st + lVar1 * 4 + 0x38);
  }
  return;
}

Assistant:

void glue(helper_aesdec, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int i;
    Reg st = *d;
    Reg rk = *s;

    for (i = 0 ; i < 4 ; i++) {
        d->L(i) = rk.L(i) ^ bswap32(AES_Td0[st.B(AES_ishifts[4*i+0])] ^
                                    AES_Td1[st.B(AES_ishifts[4*i+1])] ^
                                    AES_Td2[st.B(AES_ishifts[4*i+2])] ^
                                    AES_Td3[st.B(AES_ishifts[4*i+3])]);
    }
}